

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StateReader.cpp
# Opt level: O2

EStatusCode __thiscall StateReader::Start(StateReader *this,string *inStateFilePath)

{
  EStatusCode EVar1;
  Trace *pTVar2;
  IByteReaderWithPosition *inSourceStream;
  PDFDictionary *this_00;
  PDFObject *inOriginal;
  PDFIndirectObjectReference *pPVar3;
  allocator<char> local_49;
  string local_48;
  PDFObjectCastPtr<PDFIndirectObjectReference> rootObject;
  
  EVar1 = InputFile::OpenFile(&this->mInputFile,inStateFilePath);
  if (EVar1 == eSuccess) {
    inSourceStream = InputFile::GetInputStream(&this->mInputFile);
    EVar1 = PDFParser::StartStateFileParsing(&this->mParser,inSourceStream);
    if (EVar1 == eSuccess) {
      this_00 = PDFParser::GetTrailer(&this->mParser);
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_48,"Root",&local_49);
      inOriginal = PDFDictionary::QueryDirectObject(this_00,&local_48);
      pPVar3 = PDFObjectCast<PDFIndirectObjectReference>(inOriginal);
      rootObject.super_RefCountPtr<PDFIndirectObjectReference>._vptr_RefCountPtr =
           (_func_int **)&PTR__RefCountPtr_0036db20;
      rootObject.super_RefCountPtr<PDFIndirectObjectReference>.mValue = pPVar3;
      std::__cxx11::string::~string((string *)&local_48);
      this->mRootObject = pPVar3->mObjectID;
      RefCountPtr<PDFIndirectObjectReference>::~RefCountPtr
                (&rootObject.super_RefCountPtr<PDFIndirectObjectReference>);
      return eSuccess;
    }
    pTVar2 = Trace::DefaultTrace();
    Trace::TraceToLog(pTVar2,"StateReader::Start, unable to start parsing for the state reader file"
                     );
  }
  else {
    pTVar2 = Trace::DefaultTrace();
    Trace::TraceToLog(pTVar2,"StateReader::Start, can\'t open file for state reading in %s",
                      (inStateFilePath->_M_dataplus)._M_p);
  }
  return eFailure;
}

Assistant:

EStatusCode StateReader::Start(const std::string& inStateFilePath)
{
	// open the new file...
	if(mInputFile.OpenFile(inStateFilePath) != PDFHummus::eSuccess)
	{
		TRACE_LOG1("StateReader::Start, can't open file for state reading in %s",inStateFilePath.c_str());
		return PDFHummus::eFailure;
	}
	
	if(mParser.StartStateFileParsing(mInputFile.GetInputStream()) != PDFHummus::eSuccess)
	{
		TRACE_LOG("StateReader::Start, unable to start parsing for the state reader file");
		return PDFHummus::eFailure;
	}

	// set the root object
	PDFObjectCastPtr<PDFIndirectObjectReference> rootObject(mParser.GetTrailer()->QueryDirectObject("Root"));
	mRootObject = rootObject->mObjectID;

	return PDFHummus::eSuccess;
}